

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
PairMatcherImpl<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
::ExplainSuccess(PairMatcherImpl<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                 *this,string *first_explanation,string *second_explanation,
                MatchResultListener *listener)

{
  ulong uVar1;
  MatchResultListener *pMVar2;
  MatchResultListener *listener_local;
  string *second_explanation_local;
  string *first_explanation_local;
  PairMatcherImpl<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  *this_local;
  
  MatchResultListener::operator<<(listener,(char (*) [24])"whose both fields match");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pMVar2 = MatchResultListener::operator<<
                       (listener,(char (*) [36])", where the first field is a value ");
    MatchResultListener::operator<<(pMVar2,first_explanation);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    MatchResultListener::operator<<(listener,(char (*) [3])0x21c619);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      MatchResultListener::operator<<(listener,(char (*) [5])0x212033);
    }
    else {
      MatchResultListener::operator<<(listener,(char (*) [7])0x220a31);
    }
    pMVar2 = MatchResultListener::operator<<(listener,(char (*) [29])"the second field is a value ")
    ;
    MatchResultListener::operator<<(pMVar2,second_explanation);
  }
  return;
}

Assistant:

void ExplainSuccess(const std::string& first_explanation,
                      const std::string& second_explanation,
                      MatchResultListener* listener) const {
    *listener << "whose both fields match";
    if (!first_explanation.empty()) {
      *listener << ", where the first field is a value " << first_explanation;
    }
    if (!second_explanation.empty()) {
      *listener << ", ";
      if (!first_explanation.empty()) {
        *listener << "and ";
      } else {
        *listener << "where ";
      }
      *listener << "the second field is a value " << second_explanation;
    }
  }